

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

size_t __thiscall wasm::IRBuilder::ChildPopper::Constraint::size(Constraint *this)

{
  bool bVar1;
  Type *this_00;
  unsigned_long *puVar2;
  optional<wasm::Type> oVar3;
  optional<unsigned_long> oVar4;
  _Storage<unsigned_long,_true> local_38;
  optional<unsigned_long> arity;
  optional<wasm::Type> type;
  Constraint *this_local;
  
  oVar3 = getSubtype(this);
  arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ =
       oVar3.super__Optional_base<wasm::Type,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Type>._M_payload;
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     &arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_long>._M_engaged);
  if (bVar1) {
    this_00 = std::optional<wasm::Type>::operator->
                        ((optional<wasm::Type> *)
                         &arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                          super__Optional_payload_base<unsigned_long>._M_engaged);
    this_local = (Constraint *)wasm::Type::size(this_00);
  }
  else {
    oVar4 = getAnyTuple(this);
    local_38._M_value =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    arity.super__Optional_base<unsigned_long,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_38);
    if (bVar1) {
      puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)&local_38);
      this_local = (Constraint *)*puVar2;
    }
    else {
      this_local = (Constraint *)0x1;
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t size() const {
      if (auto type = getSubtype()) {
        return type->size();
      }
      if (auto arity = getAnyTuple()) {
        return *arity;
      }
      return 1;
    }